

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QBitArray * __thiscall QVariant::toBitArray(QBitArray *__return_storage_ptr__,QVariant *this)

{
  qvariant_cast<QBitArray>(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

QBitArray QVariant::toBitArray() const
{
    return qvariant_cast<QBitArray>(*this);
}